

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEnumVal.cpp
# Opt level: O2

void processAttributes(XMLAttDefList *attList,bool margin)

{
  XMLAttDefList *pXVar1;
  char cVar2;
  ulong uVar3;
  long *plVar4;
  ostream *poVar5;
  XMLCh *pXVar6;
  uint uVar7;
  ulong uVar8;
  StrX local_48;
  XMLAttDefList *local_40;
  ulong local_38;
  
  cVar2 = (**(code **)(*(long *)attList + 0x28))();
  if (cVar2 == '\0') {
    if (margin) {
      std::operator<<((ostream *)&std::cout,"\t");
    }
    std::operator<<((ostream *)&std::cout,"Attributes:\n");
    uVar7 = 0;
    local_40 = attList;
    while( true ) {
      pXVar1 = local_40;
      uVar8 = (ulong)uVar7;
      uVar3 = (**(code **)(*(long *)local_40 + 0x50))(local_40);
      if (uVar3 <= uVar8) break;
      local_38 = uVar8;
      plVar4 = (long *)(**(code **)(*(long *)pXVar1 + 0x58))(pXVar1,uVar8);
      poVar5 = std::operator<<((ostream *)&std::cout,"\tName:\t\t\t");
      pXVar6 = (XMLCh *)(**(code **)(*plVar4 + 0x28))(plVar4);
      StrX::StrX(&local_48,pXVar6);
      std::operator<<(poVar5,local_48.fLocalForm);
      std::operator<<(poVar5,"\n");
      StrX::~StrX(&local_48);
      std::operator<<((ostream *)&std::cout,"\tType:\t\t\t");
      pXVar6 = (XMLCh *)xercesc_4_0::XMLAttDef::getAttTypeString
                                  (*(AttTypes *)((long)plVar4 + 0xc),
                                   xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      StrX::StrX(&local_48,pXVar6);
      std::operator<<((ostream *)&std::cout,local_48.fLocalForm);
      StrX::~StrX(&local_48);
      std::operator<<((ostream *)&std::cout,"\n");
      std::operator<<((ostream *)&std::cout,"\tDefault Type:\t");
      pXVar6 = (XMLCh *)xercesc_4_0::XMLAttDef::getDefAttTypeString
                                  (*(DefAttTypes *)(plVar4 + 1),
                                   xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      StrX::StrX(&local_48,pXVar6);
      std::operator<<((ostream *)&std::cout,local_48.fLocalForm);
      uVar3 = local_38;
      StrX::~StrX(&local_48);
      std::operator<<((ostream *)&std::cout,"\n");
      if (plVar4[4] != 0) {
        std::operator<<((ostream *)&std::cout,"\tValue:\t\t\t");
        StrX::StrX(&local_48,(XMLCh *)plVar4[4]);
        std::operator<<((ostream *)&std::cout,local_48.fLocalForm);
        StrX::~StrX(&local_48);
        std::operator<<((ostream *)&std::cout,"\n");
      }
      if (plVar4[5] != 0) {
        std::operator<<((ostream *)&std::cout,"\tEnumeration:\t");
        StrX::StrX(&local_48,(XMLCh *)plVar4[5]);
        std::operator<<((ostream *)&std::cout,local_48.fLocalForm);
        StrX::~StrX(&local_48);
        std::operator<<((ostream *)&std::cout,"\n");
      }
      processDatatypeValidator((DatatypeValidator *)plVar4[10],true);
      std::operator<<((ostream *)&std::cout,"\n");
      uVar7 = (int)uVar3 + 1;
    }
  }
  return;
}

Assistant:

void processAttributes( XMLAttDefList& attList, bool margin )
{
    if ( attList.isEmpty() )
    {
        return;
    }

    if ( margin )
    {
        std::cout << "\t";
    }

    std::cout << "Attributes:\n";
    for (unsigned int i=0; i<attList.getAttDefCount(); i++)
    {
        // Name
        SchemaAttDef& curAttDef = (SchemaAttDef&)attList.getAttDef(i);
        std::cout << "\tName:\t\t\t" << StrX(curAttDef.getFullName()) << "\n";

        // Type
        std::cout << "\tType:\t\t\t";
		std::cout << StrX(XMLAttDef::getAttTypeString(curAttDef.getType()));
        std::cout << "\n";

        // Default Type
        std::cout << "\tDefault Type:\t";
		std::cout << StrX(XMLAttDef::getDefAttTypeString(curAttDef.getDefaultType()));
        std::cout << "\n";

        // Value
        if( curAttDef.getValue() )
        {
            std::cout << "\tValue:\t\t\t";
            std::cout << StrX(curAttDef.getValue());
            std::cout << "\n";
        }

        // Enum. values
        if( curAttDef.getEnumeration() )
        {
            std::cout << "\tEnumeration:\t";
            std::cout << StrX(curAttDef.getEnumeration());
            std::cout << "\n";
        }

         const DatatypeValidator* dv = curAttDef.getDatatypeValidator();
         processDatatypeValidator( dv, true );

        std::cout << "\n";
    }
}